

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  int iVar1;
  ScopedElement e;
  allocator<char> local_49;
  ScopedElement local_48;
  pointer local_40;
  string local_38;
  
  LazyStat<Catch::TestCaseInfo>::reset(&(this->super_StreamingReporterBase).currentTestCaseInfo);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"OverallResult",(allocator<char> *)&local_40);
  XmlWriter::scopedElement((XmlWriter *)&local_48,(string *)&this->m_xml);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"success",(allocator<char> *)&local_40);
  XmlWriter::writeAttribute
            (local_48.m_writer,&local_38,(testCaseStats->totals).assertions.failed == 0);
  std::__cxx11::string::~string((string *)&local_38);
  iVar1 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xc])();
  if (iVar1 == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"durationInSeconds",&local_49);
    local_40 = (pointer)Timer::getElapsedSeconds(&this->m_testCaseTimer);
    XmlWriter::writeAttribute<double>(local_48.m_writer,&local_38,(double *)&local_40);
    std::__cxx11::string::~string((string *)&local_38);
  }
  XmlWriter::endElement(&this->m_xml);
  XmlWriter::ScopedElement::~ScopedElement(&local_48);
  return;
}

Assistant:

virtual void testCaseEnded( TestCaseStats const& testCaseStats ) CATCH_OVERRIDE {
            StreamingReporterBase::testCaseEnded( testCaseStats );
            XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResult" );
            e.writeAttribute( "success", testCaseStats.totals.assertions.allOk() );

            if ( m_config->showDurations() == ShowDurations::Always )
                e.writeAttribute( "durationInSeconds", m_testCaseTimer.getElapsedSeconds() );

            m_xml.endElement();
        }